

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTDMT_compressStream_generic
                 (ZSTDMT_CCtx *mtctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_CCtx_params *__dest;
  size_t *psVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  BYTE *pBVar4;
  void *pvVar5;
  XXH64_hash_t XVar6;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  ZSTD_CDict *pZVar11;
  undefined2 *puVar12;
  xxh_u64 xVar13;
  size_t sVar14;
  ZSTD_EndDirective ZVar15;
  uint uVar16;
  ZSTDMT_jobDescription *pZVar17;
  ulong uVar18;
  uint uVar19;
  size_t pos;
  long lVar20;
  BYTE *istart;
  BYTE *pBVar21;
  long lVar22;
  void *__src;
  ZSTDMT_jobDescription *pZVar23;
  ulong uVar24;
  ulong uVar25;
  size_t sVar26;
  ulong uVar27;
  BYTE *bufferStart;
  BYTE *pBVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  buffer_t buffer;
  buffer_t bVar33;
  
  if (output->size < output->pos) {
    __assert_fail("output->pos <= output->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8bf4,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if (input->size < input->pos) {
    __assert_fail("input->pos <= input->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8bf5,
                  "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                 );
  }
  if ((endOp == ZSTD_e_continue) && (mtctx->frameEnded != 0)) {
    return 0xffffffffffffffc4;
  }
  bVar31 = false;
  if ((input->pos < input->size) && (mtctx->jobReady == 0)) {
    if ((mtctx->inBuff).buffer.start == (void *)0x0) {
      if ((mtctx->inBuff).filled != 0) {
        __assert_fail("mtctx->inBuff.filled == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8c00,
                      "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      uVar19 = mtctx->doneJobID;
      uVar16 = mtctx->nextJobID;
      pBVar21 = (BYTE *)0x0;
      uVar29 = 0;
      if (uVar19 < uVar16) {
        do {
          uVar9 = mtctx->jobIDMask & uVar19;
          pthread_mutex_lock((pthread_mutex_t *)&mtctx->jobs[uVar9].job_mutex);
          uVar30 = mtctx->jobs[uVar9].consumed;
          pthread_mutex_unlock((pthread_mutex_t *)&mtctx->jobs[uVar9].job_mutex);
          pZVar17 = mtctx->jobs;
          uVar18 = pZVar17[uVar9].src.size;
          if (uVar30 < uVar18) {
            uVar24 = pZVar17[uVar9].prefix.size;
            uVar29 = uVar24;
            if (uVar24 == 0) {
              uVar29 = uVar18;
            }
            pBVar21 = (BYTE *)(&pZVar17[uVar9].prefix)[uVar24 == 0].start;
            if (pZVar17[uVar9].src.start < pBVar21) {
              __assert_fail("range.start <= mtctx->jobs[wJobID].src.start",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8af4,"range_t ZSTDMT_getInputDataInUse(ZSTDMT_CCtx *)");
            }
          }
          if (uVar30 < uVar18) goto LAB_0018818f;
          uVar19 = uVar19 + 1;
        } while (uVar16 != uVar19);
        pBVar21 = (BYTE *)0x0;
        uVar29 = 0;
      }
LAB_0018818f:
      if ((mtctx->inBuff).buffer.start != (void *)0x0) {
        __assert_fail("mtctx->inBuff.buffer.start == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8b47,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
      }
      uVar30 = mtctx->targetSectionSize;
      uVar18 = (mtctx->roundBuff).capacity;
      if (uVar18 < uVar30) {
        __assert_fail("mtctx->roundBuff.capacity >= target",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8b48,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
      }
      if (uVar18 - (mtctx->roundBuff).pos < uVar30) {
        sVar26 = (mtctx->inBuff).prefix.size;
        pBVar4 = (mtctx->roundBuff).buffer;
        if ((((pBVar4 == (BYTE *)0x0 || pBVar21 == (BYTE *)0x0) || (sVar26 == 0)) || (uVar29 == 0))
           || ((pBVar21 + uVar29 <= pBVar4 || (pBVar4 + sVar26 <= pBVar21)))) {
          bVar33.capacity = sVar26;
          bVar33.start = pBVar4;
          ZSTDMT_waitForLdmComplete(mtctx,bVar33);
          memmove(pBVar4,(mtctx->inBuff).prefix.start,sVar26);
          (mtctx->inBuff).prefix.start = pBVar4;
          (mtctx->roundBuff).pos = sVar26;
          goto LAB_00188221;
        }
      }
      else {
LAB_00188221:
        pBVar4 = (mtctx->roundBuff).buffer;
        pBVar28 = pBVar4 + (mtctx->roundBuff).pos;
        if (((pBVar4 == (BYTE *)0x0 || pBVar21 == (BYTE *)0x0) || (uVar30 == 0)) ||
           ((uVar29 == 0 || ((pBVar21 + uVar29 <= pBVar28 || (pBVar28 + uVar30 <= pBVar21)))))) {
          pBVar21 = (BYTE *)(mtctx->inBuff).prefix.start;
          if ((pBVar21 != (BYTE *)0x0 && pBVar4 != (BYTE *)0x0) &&
             (sVar14 = (mtctx->inBuff).prefix.size,
             (pBVar28 < pBVar21 + sVar14 && (sVar14 != 0 && uVar30 != 0)) &&
             pBVar21 < pBVar28 + uVar30)) {
            __assert_fail("!ZSTDMT_isOverlapped(buffer, mtctx->inBuff.prefix)",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8b63,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
          }
          buffer.capacity = uVar30;
          buffer.start = pBVar28;
          ZSTDMT_waitForLdmComplete(mtctx,buffer);
          (mtctx->inBuff).buffer.start = pBVar28;
          (mtctx->inBuff).buffer.capacity = uVar30;
          (mtctx->inBuff).filled = 0;
          if ((mtctx->roundBuff).capacity < uVar30 + (mtctx->roundBuff).pos) {
            __assert_fail("mtctx->roundBuff.pos + buffer.capacity <= mtctx->roundBuff.capacity",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8b71,"int ZSTDMT_tryGetInputRange(ZSTDMT_CCtx *)");
          }
          goto LAB_00188363;
        }
      }
      if (mtctx->doneJobID == mtctx->nextJobID) {
        __assert_fail("mtctx->doneJobID != mtctx->nextJobID",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8c06,
                      "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
    }
LAB_00188363:
    pvVar5 = (mtctx->inBuff).buffer.start;
    bVar8 = false;
    bVar31 = false;
    if (pvVar5 != (void *)0x0) {
      __src = (void *)((long)input->src + input->pos);
      uVar18 = input->size - input->pos;
      uVar29 = (mtctx->inBuff).filled;
      uVar30 = mtctx->targetSectionSize - uVar29;
      if (uVar18 < uVar30) {
        uVar30 = uVar18;
      }
      sVar26 = uVar30;
      if ((((mtctx->params).rsyncable != 0) && (0x1ffff < uVar18 + uVar29)) &&
         (0x1f < uVar30 + uVar29)) {
        uVar18 = (mtctx->rsync).hitMask;
        if (uVar29 < 0x20000) {
          uVar25 = -uVar29 + 0x20000;
          if (uVar29 < 0x1ffe1) {
            lVar22 = (long)__src + -uVar29 + 0x1ffe0;
            lVar20 = 0;
            uVar24 = 0;
            do {
              uVar24 = uVar24 * -0x30e44323485a9b9d + (ulong)*(byte *)(lVar22 + lVar20) + 10;
              lVar20 = lVar20 + 1;
            } while (lVar20 != 0x20);
          }
          else {
            if (uVar29 == 0x1ffe0) {
              uVar24 = 0;
            }
            else {
              uVar27 = 0x1ffe0;
              uVar24 = 0;
              do {
                uVar24 = uVar24 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar5 + uVar27) + 10
                ;
                uVar27 = uVar27 + 1;
              } while (uVar29 != uVar27);
            }
            lVar22 = (long)pvVar5 + (uVar29 - 0x20);
            uVar27 = 0;
            do {
              uVar24 = uVar24 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)__src + uVar27) + 10;
              uVar27 = uVar27 + 1;
            } while (uVar25 != uVar27);
          }
        }
        else {
          lVar22 = (long)pvVar5 + (uVar29 - 0x20);
          lVar20 = -0x20;
          uVar24 = 0;
          do {
            uVar24 = uVar24 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)pvVar5 + lVar20 + uVar29)
                     + 10;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0);
          bVar8 = true;
          uVar25 = 0;
          sVar26 = 0;
          if ((uVar18 & ~uVar24) == 0) goto LAB_00188433;
        }
        if (0x1f < uVar25) {
          lVar20 = -0x20;
          uVar27 = 0;
          do {
            uVar27 = uVar27 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)__src + lVar20 + uVar25)
                     + 10;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0);
          if (uVar27 != uVar24) {
            __assert_fail("pos < RSYNC_LENGTH || ZSTD_rollingHash_compute(istart + pos - RSYNC_LENGTH, RSYNC_LENGTH) == hash"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8bcc,
                          "syncPoint_t findSynchronizationPoint(const ZSTDMT_CCtx *, const ZSTD_inBuffer)"
                         );
          }
        }
        bVar8 = false;
        if (uVar25 < uVar30) {
          bVar8 = false;
          do {
            lVar20 = (long)__src + -0x20;
            if (uVar25 < 0x20) {
              lVar20 = lVar22;
            }
            if (uVar25 + uVar29 < 0x20000) {
              __assert_fail("mtctx->inBuff.filled + pos >= RSYNC_MIN_BLOCK_SIZE",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8bd5,
                            "syncPoint_t findSynchronizationPoint(const ZSTDMT_CCtx *, const ZSTD_inBuffer)"
                           );
            }
            uVar24 = (uVar24 - ((ulong)*(byte *)(lVar20 + uVar25) + 10) * (mtctx->rsync).primePower)
                     * -0x30e44323485a9b9d + (ulong)*(byte *)((long)__src + uVar25) + 10;
            uVar27 = uVar25 + 1;
            if ((uVar18 & ~uVar24) == 0) {
              bVar8 = true;
              uVar25 = uVar27;
              uVar30 = uVar27;
              break;
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 < uVar30);
        }
        sVar26 = uVar30;
        if (0x1f < uVar25) {
          lVar20 = -0x20;
          uVar30 = 0;
          do {
            uVar30 = uVar30 * -0x30e44323485a9b9d + (ulong)*(byte *)((long)__src + lVar20 + uVar25)
                     + 10;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0);
          if (uVar30 != uVar24) {
            __assert_fail("pos < RSYNC_LENGTH || ZSTD_rollingHash_compute(istart + pos - RSYNC_LENGTH, RSYNC_LENGTH) == hash"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8bdd,
                          "syncPoint_t findSynchronizationPoint(const ZSTDMT_CCtx *, const ZSTD_inBuffer)"
                         );
          }
        }
      }
LAB_00188433:
      if ((mtctx->inBuff).buffer.capacity < mtctx->targetSectionSize) {
        __assert_fail("mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8c0f,
                      "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                     );
      }
      ZVar15 = ZSTD_e_flush;
      if (!bVar8) {
        ZVar15 = endOp;
      }
      if (endOp == ZSTD_e_continue) {
        endOp = ZVar15;
      }
      memcpy((void *)((long)pvVar5 + uVar29),__src,sVar26);
      input->pos = input->pos + sVar26;
      psVar1 = &(mtctx->inBuff).filled;
      *psVar1 = *psVar1 + sVar26;
      bVar31 = sVar26 != 0;
    }
  }
  if ((input->pos < input->size) && (endOp == ZSTD_e_end)) {
    sVar14 = (mtctx->inBuff).filled;
    endOp = ZSTD_e_flush;
    if ((sVar14 != 0) && ((sVar14 != mtctx->targetSectionSize && ((mtctx->params).rsyncable == 0))))
    {
      __assert_fail("mtctx->inBuff.filled == 0 || mtctx->inBuff.filled == mtctx->targetSectionSize || mtctx->params.rsyncable"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8c1f,
                    "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
  }
  if ((((mtctx->jobReady != 0) ||
       (uVar29 = (mtctx->inBuff).filled, mtctx->targetSectionSize <= uVar29)) ||
      (endOp != ZSTD_e_continue && uVar29 != 0)) ||
     ((endOp == ZSTD_e_end && (mtctx->frameEnded == 0)))) {
    uVar29 = (mtctx->inBuff).filled;
    if (mtctx->targetSectionSize < uVar29) {
      __assert_fail("mtctx->inBuff.filled <= mtctx->targetSectionSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8c28,
                    "size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    uVar19 = mtctx->jobIDMask;
    uVar16 = uVar19 & mtctx->nextJobID;
    if (mtctx->doneJobID + uVar19 < mtctx->nextJobID) {
      if (uVar16 != (mtctx->doneJobID & uVar19)) {
        __assert_fail("(mtctx->nextJobID & mtctx->jobIDMask) == (mtctx->doneJobID & mtctx->jobIDMask)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8a36,
                      "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)"
                     );
      }
    }
    else {
      if (mtctx->jobReady == 0) {
        pZVar17 = mtctx->jobs;
        pvVar5 = (mtctx->inBuff).buffer.start;
        pZVar17[uVar16].src.start = pvVar5;
        pZVar17[uVar16].src.size = uVar29;
        sVar14 = (mtctx->inBuff).prefix.size;
        pZVar17[uVar16].prefix.start = (mtctx->inBuff).prefix.start;
        pZVar17[uVar16].prefix.size = sVar14;
        __dest = &mtctx->jobs[uVar16].params;
        *(undefined8 *)((long)(__dest + -1) + 8) = 0;
        *(undefined8 *)((long)(__dest + -1) + 0x10) = 0;
        memcpy(__dest,&mtctx->params,0xd0);
        if (mtctx->nextJobID == 0) {
          pZVar11 = mtctx->cdict;
        }
        else {
          pZVar11 = (ZSTD_CDict *)0x0;
        }
        pZVar17 = mtctx->jobs;
        pZVar17[uVar16].cdict = pZVar11;
        pZVar17[uVar16].fullFrameSize = mtctx->frameContentSize;
        pZVar17[uVar16].dstBuff.start = (void *)0x0;
        pZVar17[uVar16].dstBuff.capacity = 0;
        pZVar17 = mtctx->jobs;
        uVar2 = mtctx->bufPool;
        uVar3 = mtctx->cctxPool;
        auVar32._8_4_ = (int)uVar2;
        auVar32._0_8_ = uVar3;
        auVar32._12_4_ = (int)((ulong)uVar2 >> 0x20);
        pZVar17[uVar16].cctxPool = (ZSTDMT_CCtxPool *)uVar3;
        pZVar17[uVar16].bufPool = (ZSTDMT_bufferPool *)auVar32._8_8_;
        pZVar17[uVar16].seqPool = mtctx->seqPool;
        pZVar17[uVar16].serial = &mtctx->serial;
        uVar19 = mtctx->nextJobID;
        pZVar17[uVar16].jobID = uVar19;
        pZVar17[uVar16].firstJob = (uint)(uVar19 == 0);
        pZVar17[uVar16].lastJob = (uint)(endOp == ZSTD_e_end);
        pZVar17[uVar16].frameChecksumNeeded =
             (uint)(((mtctx->params).fParams.checksumFlag != 0 && uVar19 != 0) &&
                   endOp == ZSTD_e_end);
        pZVar17[uVar16].dstFlushed = 0;
        psVar1 = &(mtctx->roundBuff).pos;
        *psVar1 = *psVar1 + uVar29;
        (mtctx->inBuff).filled = 0;
        (mtctx->inBuff).buffer.start = (void *)0x0;
        (mtctx->inBuff).buffer.capacity = 0;
        if (endOp == ZSTD_e_end) {
          (mtctx->inBuff).prefix.start = (void *)0x0;
          (mtctx->inBuff).prefix.size = 0;
          mtctx->frameEnded = (uint)(endOp == ZSTD_e_end);
          if (uVar19 == 0) {
            (mtctx->params).fParams.checksumFlag = 0;
          }
        }
        else {
          uVar30 = mtctx->targetPrefixSize;
          if (uVar29 <= mtctx->targetPrefixSize) {
            uVar30 = uVar29;
          }
          (mtctx->inBuff).prefix.start = (void *)((long)pvVar5 + (uVar29 - uVar30));
          (mtctx->inBuff).prefix.size = uVar30;
        }
        if (uVar29 == 0 && uVar19 != 0) {
          if (endOp != ZSTD_e_end) {
            __assert_fail("endOp == ZSTD_e_end",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8a66,
                          "size_t ZSTDMT_createCompressionJob(ZSTDMT_CCtx *, size_t, ZSTD_EndDirective)"
                         );
          }
          if (pZVar17[uVar16].lastJob != 1) {
            __assert_fail("job->lastJob == 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8a1f,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
          }
          pZVar17 = pZVar17 + uVar16;
          if ((pZVar17->src).size != 0) {
            __assert_fail("job->src.size == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8a20,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
          }
          if (pZVar17->firstJob != 0) {
            __assert_fail("job->firstJob == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8a21,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
          }
          if ((pZVar17->dstBuff).start != (void *)0x0) {
            __assert_fail("job->dstBuff.start == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8a22,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
          }
          bVar33 = ZSTDMT_getBuffer(pZVar17->bufPool);
          puVar12 = (undefined2 *)bVar33.start;
          pZVar17->dstBuff = bVar33;
          if (puVar12 == (undefined2 *)0x0) {
            pZVar17->cSize = 0xffffffffffffffc0;
          }
          else {
            if (bVar33.capacity < 3) {
              __assert_fail("job->dstBuff.capacity >= ZSTD_blockHeaderSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8a28,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
            }
            (pZVar17->src).start = (void *)0x0;
            (pZVar17->src).size = 0;
            *puVar12 = 1;
            *(undefined1 *)(puVar12 + 1) = 0;
            pZVar17->cSize = 3;
            if (pZVar17->consumed != 0) {
              __assert_fail("job->consumed == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x8a2c,"void ZSTDMT_writeLastEmptyBlock(ZSTDMT_jobDescription *)");
            }
          }
          mtctx->nextJobID = mtctx->nextJobID + 1;
          goto LAB_00188749;
        }
      }
      iVar10 = POOL_tryAdd(mtctx->factory,ZSTDMT_compressionJob,mtctx->jobs + uVar16);
      if (iVar10 != 0) {
        mtctx->nextJobID = mtctx->nextJobID + 1;
      }
      mtctx->jobReady = (uint)(iVar10 == 0);
    }
  }
LAB_00188749:
  if (output->size < output->pos) {
    __assert_fail("output->size >= output->pos",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8a89,
                  "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                 );
  }
  uVar19 = mtctx->jobIDMask & mtctx->doneJobID;
  pZVar17 = mtctx->jobs;
  pthread_mutex_lock((pthread_mutex_t *)&pZVar17[uVar19].job_mutex);
  if ((!bVar31) && (mtctx->doneJobID < mtctx->nextJobID)) {
    pZVar23 = mtctx->jobs;
    pZVar17 = (ZSTDMT_jobDescription *)pZVar23[uVar19].cSize;
    if (pZVar17 < (ZSTDMT_jobDescription *)pZVar23[uVar19].dstFlushed) {
      __assert_fail("mtctx->jobs[wJobID].dstFlushed <= mtctx->jobs[wJobID].cSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8a8e,
                    "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                   );
    }
    if ((ZSTDMT_jobDescription *)pZVar23[uVar19].dstFlushed == pZVar17) {
      do {
        pZVar23 = pZVar23 + uVar19;
        if (pZVar23->consumed == (pZVar23->src).size) break;
        pthread_cond_wait((pthread_cond_t *)&pZVar23->job_cond,
                          (pthread_mutex_t *)&pZVar23->job_mutex);
        pZVar23 = mtctx->jobs;
        pZVar17 = (ZSTDMT_jobDescription *)pZVar23[uVar19].dstFlushed;
      } while (pZVar17 == (ZSTDMT_jobDescription *)pZVar23[uVar19].cSize);
    }
  }
  pZVar23 = mtctx->jobs + uVar19;
  uVar29 = pZVar23->consumed;
  uVar30 = pZVar23->cSize;
  uVar18 = (pZVar23->src).size;
  pthread_mutex_unlock((pthread_mutex_t *)&pZVar23->job_mutex);
  if (uVar30 < 0xffffffffffffff89) {
    if (uVar18 < uVar29) {
      __assert_fail("srcConsumed <= srcSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8aa7,
                    "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                   );
    }
    if ((uVar29 == uVar18) && (pZVar23 = mtctx->jobs, pZVar23[uVar19].frameChecksumNeeded != 0)) {
      uVar24 = (mtctx->serial).xxhState.total_len;
      if (uVar24 < 0x20) {
        lVar20 = (mtctx->serial).xxhState.v[2] + 0x27d4eb2f165667c5;
      }
      else {
        XVar6 = (mtctx->serial).xxhState.v[0];
        uVar25 = (mtctx->serial).xxhState.v[1];
        uVar27 = (mtctx->serial).xxhState.v[2];
        uVar7 = (mtctx->serial).xxhState.v[3];
        pZVar17 = (ZSTDMT_jobDescription *)
                  (((uVar25 * -0x6c158a5880000000 | uVar25 * -0x3d4d51c2d82b14b1 >> 0x21) *
                    -0x61c8864e7a143579 ^
                   ((XVar6 * -0x6c158a5880000000 | XVar6 * -0x3d4d51c2d82b14b1 >> 0x21) *
                    -0x61c8864e7a143579 ^
                   (uVar7 << 0x12 | uVar7 >> 0x2e) + (uVar27 << 0xc | uVar27 >> 0x34) +
                   (uVar25 << 7 | uVar25 >> 0x39) + (XVar6 << 1 | (ulong)((long)XVar6 < 0))) *
                   -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
                  0x85ebca77c2b2ae63);
        lVar20 = ((uVar7 * -0x6c158a5880000000 | uVar7 * -0x3d4d51c2d82b14b1 >> 0x21) *
                  -0x61c8864e7a143579 ^
                 ((uVar27 * -0x6c158a5880000000 | uVar27 * -0x3d4d51c2d82b14b1 >> 0x21) *
                  -0x61c8864e7a143579 ^ (ulong)pZVar17) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63)
                 * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
      }
      xVar13 = XXH64_finalize(lVar20 + uVar24,(xxh_u8 *)(mtctx->serial).xxhState.mem64,uVar24,
                              (XXH_alignment)pZVar17);
      *(int *)((long)pZVar23[uVar19].dstBuff.start + pZVar23[uVar19].cSize) = (int)xVar13;
      uVar30 = uVar30 + 4;
      pZVar23[uVar19].cSize = pZVar23[uVar19].cSize + 4;
      pZVar23[uVar19].frameChecksumNeeded = 0;
    }
    if (uVar30 != 0) {
      pZVar17 = mtctx->jobs;
      uVar25 = uVar30 - pZVar17[uVar19].dstFlushed;
      uVar24 = output->size - output->pos;
      if (uVar25 < uVar24) {
        uVar24 = uVar25;
      }
      if (mtctx->nextJobID <= mtctx->doneJobID) {
        __assert_fail("mtctx->doneJobID < mtctx->nextJobID",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8ab6,
                      "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                     );
      }
      if (uVar30 < pZVar17[uVar19].dstFlushed) {
        __assert_fail("cSize >= mtctx->jobs[wJobID].dstFlushed",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8ab7,
                      "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                     );
      }
      pvVar5 = pZVar17[uVar19].dstBuff.start;
      if (pvVar5 == (void *)0x0) {
        __assert_fail("mtctx->jobs[wJobID].dstBuff.start != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8ab8,
                      "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                     );
      }
      if (uVar24 != 0) {
        memcpy((void *)(output->pos + (long)output->dst),
               (void *)((long)pvVar5 + pZVar17[uVar19].dstFlushed),uVar24);
      }
      output->pos = output->pos + uVar24;
      pZVar17 = mtctx->jobs;
      pZVar17[uVar19].dstFlushed = pZVar17[uVar19].dstFlushed + uVar24;
      if ((uVar29 == uVar18) && (pZVar17[uVar19].dstFlushed == uVar30)) {
        ZSTDMT_releaseBuffer(mtctx->bufPool,pZVar17[uVar19].dstBuff);
        pZVar17 = mtctx->jobs;
        pZVar17[uVar19].dstBuff.start = (void *)0x0;
        pZVar17[uVar19].dstBuff.capacity = 0;
        mtctx->jobs[uVar19].cSize = 0;
        mtctx->consumed = uVar18 + mtctx->consumed;
        mtctx->produced = uVar30 + mtctx->produced;
        mtctx->doneJobID = mtctx->doneJobID + 1;
      }
    }
    psVar1 = &mtctx->jobs[uVar19].dstFlushed;
    bVar31 = uVar30 < *psVar1;
    uVar30 = uVar30 - *psVar1;
    if (bVar31 || uVar30 == 0) {
      bVar31 = uVar18 <= uVar29;
      uVar30 = 1;
      goto LAB_00188b5c;
    }
  }
  else {
    ZSTDMT_waitForAllJobsCompleted(mtctx);
    ZSTDMT_releaseAllJobResources(mtctx);
  }
  bVar31 = false;
LAB_00188b5c:
  if ((((bVar31) && (uVar30 = 1, mtctx->nextJobID <= mtctx->doneJobID)) && (mtctx->jobReady == 0))
     && ((mtctx->inBuff).filled == 0)) {
    mtctx->allJobsCompleted = mtctx->frameEnded;
    uVar30 = 0;
    if (endOp == ZSTD_e_end) {
      uVar30 = (ulong)(mtctx->frameEnded == 0);
    }
  }
  sVar14 = uVar30 + (uVar30 == 0);
  if (input->size <= input->pos) {
    sVar14 = uVar30;
  }
  return sVar14;
}

Assistant:

size_t ZSTDMT_compressStream_generic(ZSTDMT_CCtx* mtctx,
                                     ZSTD_outBuffer* output,
                                     ZSTD_inBuffer* input,
                                     ZSTD_EndDirective endOp)
{
    unsigned forwardInputProgress = 0;
    DEBUGLOG(5, "ZSTDMT_compressStream_generic (endOp=%u, srcSize=%u)",
                (U32)endOp, (U32)(input->size - input->pos));
    assert(output->pos <= output->size);
    assert(input->pos  <= input->size);

    if ((mtctx->frameEnded) && (endOp==ZSTD_e_continue)) {
        /* current frame being ended. Only flush/end are allowed */
        return ERROR(stage_wrong);
    }

    /* fill input buffer */
    if ( (!mtctx->jobReady)
      && (input->size > input->pos) ) {   /* support NULL input */
        if (mtctx->inBuff.buffer.start == NULL) {
            assert(mtctx->inBuff.filled == 0); /* Can't fill an empty buffer */
            if (!ZSTDMT_tryGetInputRange(mtctx)) {
                /* It is only possible for this operation to fail if there are
                 * still compression jobs ongoing.
                 */
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange failed");
                assert(mtctx->doneJobID != mtctx->nextJobID);
            } else
                DEBUGLOG(5, "ZSTDMT_tryGetInputRange completed successfully : mtctx->inBuff.buffer.start = %p", mtctx->inBuff.buffer.start);
        }
        if (mtctx->inBuff.buffer.start != NULL) {
            syncPoint_t const syncPoint = findSynchronizationPoint(mtctx, *input);
            if (syncPoint.flush && endOp == ZSTD_e_continue) {
                endOp = ZSTD_e_flush;
            }
            assert(mtctx->inBuff.buffer.capacity >= mtctx->targetSectionSize);
            DEBUGLOG(5, "ZSTDMT_compressStream_generic: adding %u bytes on top of %u to buffer of size %u",
                        (U32)syncPoint.toLoad, (U32)mtctx->inBuff.filled, (U32)mtctx->targetSectionSize);
            ZSTD_memcpy((char*)mtctx->inBuff.buffer.start + mtctx->inBuff.filled, (const char*)input->src + input->pos, syncPoint.toLoad);
            input->pos += syncPoint.toLoad;
            mtctx->inBuff.filled += syncPoint.toLoad;
            forwardInputProgress = syncPoint.toLoad>0;
        }
    }
    if ((input->pos < input->size) && (endOp == ZSTD_e_end)) {
        /* Can't end yet because the input is not fully consumed.
            * We are in one of these cases:
            * - mtctx->inBuff is NULL & empty: we couldn't get an input buffer so don't create a new job.
            * - We filled the input buffer: flush this job but don't end the frame.
            * - We hit a synchronization point: flush this job but don't end the frame.
            */
        assert(mtctx->inBuff.filled == 0 || mtctx->inBuff.filled == mtctx->targetSectionSize || mtctx->params.rsyncable);
        endOp = ZSTD_e_flush;
    }

    if ( (mtctx->jobReady)
      || (mtctx->inBuff.filled >= mtctx->targetSectionSize)  /* filled enough : let's compress */
      || ((endOp != ZSTD_e_continue) && (mtctx->inBuff.filled > 0))  /* something to flush : let's go */
      || ((endOp == ZSTD_e_end) && (!mtctx->frameEnded)) ) {   /* must finish the frame with a zero-size block */
        size_t const jobSize = mtctx->inBuff.filled;
        assert(mtctx->inBuff.filled <= mtctx->targetSectionSize);
        FORWARD_IF_ERROR( ZSTDMT_createCompressionJob(mtctx, jobSize, endOp) , "");
    }

    /* check for potential compressed data ready to be flushed */
    {   size_t const remainingToFlush = ZSTDMT_flushProduced(mtctx, output, !forwardInputProgress, endOp); /* block if there was no forward input progress */
        if (input->pos < input->size) return MAX(remainingToFlush, 1);  /* input not consumed : do not end flush yet */
        DEBUGLOG(5, "end of ZSTDMT_compressStream_generic: remainingToFlush = %u", (U32)remainingToFlush);
        return remainingToFlush;
    }
}